

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

_Bool testbinaryfuse16(size_t size)

{
  uint uVar1;
  undefined1 auVar2 [16];
  _Bool _Var3;
  uint64_t *keys;
  clock_t cVar4;
  clock_t cVar5;
  uint64_t uVar6;
  uint32_t size_00;
  long lVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  binary_fuse16_t local_58;
  
  iVar8 = 0;
  printf("testing binary fuse16 ");
  printf("size = %zu \n",size);
  size_00 = (uint32_t)size;
  local_58.Size = size_00;
  if (size_00 == 0) {
    local_58.SegmentLength = 4;
    local_58.SegmentLengthMask = 3;
    uVar9 = 4;
  }
  else {
    dVar10 = (double)(size & 0xffffffff);
    dVar11 = log(dVar10);
    dVar11 = floor(dVar11 / 1.2029723039923526 + 2.25);
    uVar9 = 0x40000;
    if ((uint)(long)dVar11 < 0x13) {
      uVar9 = 1 << ((byte)(long)dVar11 & 0x1f);
    }
    local_58.SegmentLengthMask = uVar9 - 1;
    local_58.SegmentLength = uVar9;
    if (size_00 != 1) {
      dVar11 = log(dVar10);
      dVar11 = 3.4538776394910684 / dVar11 + 0.875;
      if (dVar11 <= 1.125) {
        dVar11 = 1.125;
      }
      dVar10 = round(dVar11 * dVar10);
      iVar8 = (int)(long)dVar10;
    }
  }
  uVar1 = ((uVar9 + (-uVar9 & (iVar8 + uVar9) - 1)) - 1) / uVar9;
  local_58.SegmentCount = 1;
  if (2 < uVar1) {
    local_58.SegmentCount = uVar1 - 2;
  }
  local_58.ArrayLength = (local_58.SegmentCount + 2) * uVar9;
  local_58.SegmentCountLength = local_58.SegmentCount * uVar9;
  local_58.Fingerprints = (uint16_t *)calloc((ulong)local_58.ArrayLength,2);
  keys = (uint64_t *)malloc(size * 8);
  auVar2 = _DAT_00107060;
  if (size != 0) {
    lVar7 = size - 1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar12 = auVar12 ^ _DAT_00107060;
    auVar13 = _DAT_00107050;
    do {
      auVar14 = auVar13 ^ auVar2;
      if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                  auVar12._4_4_ < auVar14._4_4_) & 1)) {
        keys[uVar6] = uVar6;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        keys[uVar6 + 1] = uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar7 + 2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar6);
  }
  _Var3 = binary_fuse16_populate(keys,size_00,&local_58);
  if (_Var3) {
    lVar7 = 5;
    do {
      cVar4 = clock();
      binary_fuse16_populate(keys,size_00,&local_58);
      cVar5 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar5 - cVar4) / 1000000.0,size);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    free(local_58.Fingerprints);
    free(keys);
  }
  return _Var3;
}

Assistant:

bool testbinaryfuse16(size_t size) {
  printf("testing binary fuse16 ");
  printf("size = %zu \n", size);

  binary_fuse16_t filter;

  binary_fuse16_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = binary_fuse16_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    binary_fuse16_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  binary_fuse16_free(&filter);
  free(big_set);
  return true;
}